

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_parse_sign(string *text,bool *negative_ptr)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  string local_30 [32];
  
  pcVar4 = (text->_M_dataplus)._M_p;
  pcVar1 = pcVar4 + text->_M_string_length;
  for (; (pcVar4 < pcVar1 && (*pcVar4 == ' ')); pcVar4 = pcVar4 + 1) {
  }
  do {
    pcVar5 = pcVar1;
    if (pcVar5 <= pcVar4) goto LAB_00293fab;
    pcVar1 = pcVar5 + -1;
  } while (pcVar5[-1] == ' ');
  cVar2 = *pcVar4;
  *negative_ptr = cVar2 == '-';
  if (((cVar2 == '-') || (*pcVar4 == '+')) && (pcVar5 <= pcVar4 + 1)) {
LAB_00293fab:
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_30,(ulong)text);
    std::__cxx11::string::operator=((string *)text,local_30);
    std::__cxx11::string::~string(local_30);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

inline bool safe_parse_sign(string* text  /*inout*/,
                            bool* negative_ptr  /*output*/) {
  const char* start = text->data();
  const char* end = start + text->size();

  // Consume whitespace.
  while (start < end && (start[0] == ' ')) {
    ++start;
  }
  while (start < end && (end[-1] == ' ')) {
    --end;
  }
  if (start >= end) {
    return false;
  }

  // Consume sign.
  *negative_ptr = (start[0] == '-');
  if (*negative_ptr || start[0] == '+') {
    ++start;
    if (start >= end) {
      return false;
    }
  }
  *text = text->substr(start - text->data(), end - start);
  return true;
}